

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int cmcmd::SymlinkLibrary
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_88 [8];
  string name;
  undefined1 local_58 [8];
  string soName;
  string realName;
  int result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  realName.field_2._12_4_ = 0;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)(soName.field_2._M_local_buf + 8),(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  std::__cxx11::string::string((string *)local_58,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,4);
  std::__cxx11::string::string((string *)local_88,(string *)pvVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&soName.field_2 + 8));
  if (bVar1) {
    bVar1 = SymlinkInternal((string *)((long)&soName.field_2 + 8),(string *)local_58);
    if (!bVar1) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
    }
    realName.field_2._13_3_ = 0;
    realName.field_2._M_local_buf[0xc] = !bVar1;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58);
  if ((bVar1) && (bVar1 = SymlinkInternal((string *)local_58,(string *)local_88), !bVar1)) {
    cmSystemTools::ReportLastSystemError("cmake_symlink_library");
    realName.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(soName.field_2._M_local_buf + 8));
  return realName.field_2._12_4_;
}

Assistant:

int cmcmd::SymlinkLibrary(std::vector<std::string>& args)
{
  int result = 0;
  std::string realName = args[2];
  std::string soName = args[3];
  std::string name = args[4];
  if(soName != realName)
    {
    if(!cmcmd::SymlinkInternal(realName, soName))
      {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      result = 1;
      }
    }
  if(name != soName)
    {
    if(!cmcmd::SymlinkInternal(soName, name))
      {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      result = 1;
      }
    }
  return result;
}